

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void glu::logShaderProgram
               (TestLog *log,ProgramInfo *programInfo,size_t numShaders,ShaderInfo **shaderInfos)

{
  ShaderInfo *pSVar1;
  TestLog *pTVar2;
  ProgramInfo *pPVar3;
  ShaderInfo **__n;
  string *psVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  byte bVar5;
  size_t shaderNdx;
  size_t sVar6;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  TestLog *local_120;
  size_t local_118;
  ProgramInfo *local_110;
  size_t local_108;
  ShaderInfo **local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [104];
  
  __n = shaderInfos;
  tcu::LogShaderProgram::LogShaderProgram
            ((LogShaderProgram *)local_98,programInfo->linkOk,&programInfo->infoLog);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_98,(int)log,__buf,(size_t)__n);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  for (sVar6 = 0; numShaders != sVar6; sVar6 = sVar6 + 1) {
    operator<<(log,shaderInfos[sVar6]);
  }
  local_120 = log;
  local_110 = programInfo;
  local_100 = shaderInfos;
  tcu::TestLog::endShaderProgram(log);
  bVar5 = 1;
  sVar6 = 0;
  local_108 = numShaders;
  while (local_108 != sVar6) {
    pSVar1 = local_100[sVar6];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,logShaderProgram::s_compileTimeDesc[pSVar1->type].name,&local_121
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,logShaderProgram::s_compileTimeDesc[pSVar1->type].description,
               &local_122);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ms",&local_123);
    psVar4 = &local_f8;
    local_118 = sVar6;
    tcu::LogNumber<float>::LogNumber
              ((LogNumber<float> *)local_98,&local_d8,&local_b8,psVar4,QP_KEY_TAG_TIME,
               (float)pSVar1->compileTimeUs / 1000.0);
    tcu::LogNumber<float>::write
              ((LogNumber<float> *)local_98,(int)local_120,__buf_00,(size_t)psVar4);
    tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_98);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    if ((bVar5 & 1) == 0) {
      bVar5 = 0;
    }
    else {
      bVar5 = pSVar1->compileOk;
    }
    sVar6 = local_118 + 1;
  }
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"LinkTime",&local_121);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Link time",&local_122);
    pPVar3 = local_110;
    pTVar2 = local_120;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ms",&local_123);
    psVar4 = &local_f8;
    tcu::LogNumber<float>::LogNumber
              ((LogNumber<float> *)local_98,&local_d8,&local_b8,psVar4,QP_KEY_TAG_TIME,
               (float)pPVar3->linkTimeUs / 1000.0);
    tcu::LogNumber<float>::write((LogNumber<float> *)local_98,(int)pTVar2,__buf_01,(size_t)psVar4);
    tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_98);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

static void logShaderProgram (tcu::TestLog& log, const ProgramInfo& programInfo, size_t numShaders, const ShaderInfo* const* shaderInfos)
{
	log << tcu::TestLog::ShaderProgram(programInfo.linkOk, programInfo.infoLog);
	try
	{
		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
			log << *shaderInfos[shaderNdx];
	}
	catch (...)
	{
		log << tcu::TestLog::EndShaderProgram;
		throw;
	}
	log << tcu::TestLog::EndShaderProgram;

	// Write statistics.
	{
		static const struct
		{
			const char*		name;
			const char*		description;
		} s_compileTimeDesc[] =
		{
			{ "VertexCompileTime",			"Vertex shader compile time"					},
			{ "FragmentCompileTime",		"Fragment shader compile time"					},
			{ "GeometryCompileTime",		"Geometry shader compile time"					},
			{ "TessControlCompileTime",		"Tesselation control shader compile time"		},
			{ "TessEvaluationCompileTime",	"Tesselation evaluation shader compile time"	},
			{ "ComputeCompileTime",			"Compute shader compile time"					},
		};
		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_compileTimeDesc) == SHADERTYPE_LAST);

		bool allShadersOk = true;

		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
		{
			const ShaderInfo&	shaderInfo	= *shaderInfos[shaderNdx];

			log << tcu::TestLog::Float(s_compileTimeDesc[shaderInfo.type].name,
									   s_compileTimeDesc[shaderInfo.type].description,
									   "ms", QP_KEY_TAG_TIME, (float)shaderInfo.compileTimeUs / 1000.0f);

			allShadersOk = allShadersOk && shaderInfo.compileOk;
		}

		if (allShadersOk)
			log << tcu::TestLog::Float("LinkTime", "Link time", "ms", QP_KEY_TAG_TIME, (float)programInfo.linkTimeUs / 1000.0f);
	}
}